

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib650.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined4 uVar4;
  char *pcVar5;
  undefined4 uVar6;
  char *pcVar7;
  undefined4 uVar8;
  long contentlength;
  char flbuf [32];
  undefined8 local_80;
  size_t formlength;
  curl_forms formarray [3];
  curl_httppost *lastptr;
  curl_httppost *formpost;
  curl_slist *headers2;
  curl_slist *headers;
  CURLFORMcode formrc;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  _formrc = 0;
  headers._4_4_ = 0x7e;
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  formarray[2].value = (char *)0x0;
  local_80 = 0;
  curl = (CURL *)URL;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    headers2 = (curl_slist *)curl_slist_append(0,"X-customheader-1: Header 1 data");
    if (headers2 != (curl_slist *)0x0) {
      formpost = (curl_httppost *)curl_slist_append(headers2,"X-customheader-2: Header 2 data");
      if (formpost == (curl_httppost *)0x0) {
        formpost = (curl_httppost *)0x0;
      }
      else {
        headers2 = (curl_slist *)formpost;
        formpost = (curl_httppost *)curl_slist_append(formpost,"Content-Type: text/plain");
        if (formpost != (curl_httppost *)0x0) {
          headers2 = (curl_slist *)formpost;
          headers._0_4_ =
               curl_formadd(&lastptr,&formarray[2].value,1,"fieldname",4,data,0xf,formpost,0x11);
          if ((int)headers == 0) {
            sVar2 = strlen(data);
            formarray[1]._0_8_ = sVar2 - 1;
            formlength._0_4_ = 5;
            formarray[0]._0_8_ = data;
            formarray[0].value._0_4_ = 6;
            formarray[1].value._0_4_ = 0x11;
            formarray[2].option = CURLFORM_NOTHING;
            formarray[2]._4_4_ = 0;
            headers._0_4_ =
                 curl_formadd(&lastptr,&formarray[2].value,2,"fieldname",3,8,8,&formlength,0x10,
                              "remotefile.txt",0x11);
            if ((int)headers == 0) {
              data[0] = data[0] + '\x01';
              uVar4 = 0xe;
              pcVar5 = "text/whatever";
              uVar6 = 10;
              uVar8 = 0x11;
              pcVar3 = libtest_arg2;
              pcVar7 = libtest_arg2;
              headers._0_4_ =
                   curl_formadd(&lastptr,&formarray[2].value,1,"multifile",10,libtest_arg2,10,
                                libtest_arg2,0xe,"text/whatever",10,libtest_arg2,0x11);
              if ((int)headers == 0) {
                headers._0_4_ =
                     curl_formadd(&lastptr,&formarray[2].value,1,"filecontents",7,libtest_arg2,0x11,
                                  pcVar3,uVar4,pcVar5,uVar6,pcVar7,uVar8);
                if ((int)headers == 0) {
                  curl_formget(lastptr,&local_80,count_chars);
                  curl_msnprintf(&contentlength,0x20,"%lu",local_80);
                  headers._0_4_ =
                       curl_formadd(&lastptr,&formarray[2].value,1,"formlength",4,&contentlength,
                                    0x11,pcVar3,uVar4,pcVar5,uVar6,pcVar7,uVar8);
                  if ((int)headers == 0) {
                    headers._0_4_ =
                         curl_formadd(&lastptr,&formarray[2].value,1,"standardinput",10,"-",0x11);
                    if ((int)headers == 0) {
                      _formrc = curl_easy_init();
                      if (_formrc == 0) {
                        curl_mfprintf(_stderr,"curl_easy_init() failed\n");
                      }
                      else {
                        headers._4_4_ = curl_easy_setopt(_formrc,0x2712,curl);
                        if ((((headers._4_4_ == 0) &&
                             (headers._4_4_ = curl_easy_setopt(_formrc,0x2728,lastptr),
                             headers._4_4_ == 0)) &&
                            (headers._4_4_ = curl_easy_setopt(_formrc,0x29,1), headers._4_4_ == 0))
                           && (headers._4_4_ = curl_easy_setopt(_formrc,0x2a,1), headers._4_4_ == 0)
                           ) {
                          headers._4_4_ = curl_easy_perform(_formrc);
                        }
                      }
                    }
                    else {
                      curl_mprintf("curl_formadd(6) = %d\n",(int)headers);
                    }
                  }
                  else {
                    curl_mprintf("curl_formadd(5) = %d\n",(int)headers);
                  }
                }
                else {
                  curl_mprintf("curl_formadd(4) = %d\n",(int)headers);
                }
              }
              else {
                curl_mprintf("curl_formadd(3) = %d\n",(int)headers);
              }
            }
            else {
              curl_mprintf("curl_formadd(2) = %d\n",(int)headers);
            }
          }
          else {
            curl_mprintf("curl_formadd(1) = %d\n",(int)headers);
          }
        }
      }
    }
    curl_easy_cleanup(_formrc);
    curl_formfree(lastptr);
    curl_slist_free_all(headers2);
    curl_global_cleanup();
    URL_local._4_4_ = headers._4_4_;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = TEST_ERR_MAJOR_BAD;
  CURLFORMcode formrc;
  struct curl_slist *headers, *headers2 = NULL;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
  struct curl_forms formarray[3];
  size_t formlength = 0;
  char flbuf[32];
  long contentlength = 0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Check proper name and data copying, as well as headers. */
  headers = curl_slist_append(NULL, "X-customheader-1: Header 1 data");
  if(!headers) {
    goto test_cleanup;
  }
  headers2 = curl_slist_append(headers, "X-customheader-2: Header 2 data");
  if(!headers2) {
    goto test_cleanup;
  }
  headers = headers2;
  headers2 = curl_slist_append(headers, "Content-Type: text/plain");
  if(!headers2) {
    goto test_cleanup;
  }
  headers = headers2;
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, &name,
                        CURLFORM_COPYCONTENTS, &data,
                        CURLFORM_CONTENTHEADER, headers,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(1) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  contentlength = (long)(strlen(data) - 1);

  /* Use a form array for the non-copy test. */
  formarray[0].option = CURLFORM_PTRCONTENTS;
  formarray[0].value = data;
  formarray[1].option = CURLFORM_CONTENTSLENGTH;
  formarray[1].value = (char *)(size_t)contentlength;
  formarray[2].option = CURLFORM_END;
  formarray[2].value = NULL;
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_PTRNAME, name,
                        CURLFORM_NAMELENGTH, strlen(name) - 1,
                        CURLFORM_ARRAY, formarray,
                        CURLFORM_FILENAME, "remotefile.txt",
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(2) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Now change in-memory data to affect CURLOPT_PTRCONTENTS value.
     Copied values (first field) must not be affected.
     CURLOPT_PTRNAME actually copies the name thus we do not test this here. */
  data[0]++;

  /* Check multi-files and content type propagation. */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "multifile",
                        CURLFORM_FILE, libtest_arg2,    /* Set in first.c. */
                        CURLFORM_FILE, libtest_arg2,
                        CURLFORM_CONTENTTYPE, "text/whatever",
                        CURLFORM_FILE, libtest_arg2,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(3) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Check data from file content. */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "filecontents",
                        CURLFORM_FILECONTENT, libtest_arg2,
                        CURLFORM_END);

  if(formrc) {
    printf("curl_formadd(4) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Measure the current form length.
   * This is done before including stdin data because we want to reuse it
   * and stdin cannot be rewound.
   */
  curl_formget(formpost, (void *) &formlength, count_chars);

  /* Include length in data for external check. */
  curl_msnprintf(flbuf, sizeof(flbuf), "%lu", (unsigned long) formlength);
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "formlength",
                        CURLFORM_COPYCONTENTS, &flbuf,
                        CURLFORM_END);
  if(formrc) {
    printf("curl_formadd(5) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  /* Check stdin (may be problematic on some platforms). */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "standardinput",
                        CURLFORM_FILE, "-",
                        CURLFORM_END);
  if(formrc) {
    printf("curl_formadd(6) = %d\n", (int) formrc);
    goto test_cleanup;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);
  curl_slist_free_all(headers);

  curl_global_cleanup();

  return res;
}